

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O1

ModportItemSyntax * __thiscall slang::parsing::Parser::parseModportItem(Parser *this)

{
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  SourceLocation SVar4;
  MemberSyntax *pMVar5;
  undefined4 extraout_var;
  AnsiPortListSyntax *ports;
  ModportItemSyntax *pMVar6;
  Info *extraout_RDX;
  Info *extraout_RDX_00;
  Info *extraout_RDX_01;
  Info *extraout_RDX_02;
  Info *src;
  Info *extraout_RDX_03;
  Info *extraout_RDX_04;
  TokenKind TVar7;
  Token name;
  Token TVar8;
  Token closeParen;
  Token openParen;
  Token local_220;
  Token local_210;
  undefined8 local_200;
  Info *local_1f8;
  Token local_1f0;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_1e0;
  undefined1 local_1d0;
  undefined1 local_1c8 [24];
  undefined1 auStack_1b0 [24];
  __extent_storage<18446744073709551615UL> local_198;
  
  TVar8 = ParserBase::expect(&this->super_ParserBase,Identifier);
  local_1f8 = TVar8.info;
  uVar3 = TVar8._0_8_;
  Token::Token(&local_1f0);
  Token::Token(&local_220);
  local_1f0 = ParserBase::expect(&this->super_ParserBase,OpenParenthesis);
  if (((undefined1  [16])local_1f0 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
    SVar4 = Token::location(&local_1f0);
    local_220 = ParserBase::missingToken(&this->super_ParserBase,CloseParenthesis,SVar4);
    auStack_1b0._8_8_ = (Info *)0x0;
    auStack_1b0._16_8_ = (pointer)0x0;
    goto LAB_001e20ab;
  }
  local_1c8._0_8_ = auStack_1b0;
  local_1c8._8_8_ = 0;
  local_1c8._16_8_ = (SyntaxNode *)0x10;
  local_210 = ParserBase::peek(&this->super_ParserBase);
  bVar1 = syntax::SyntaxFacts::isEndOfParenList(local_210.kind);
  if (bVar1) {
    bVar1 = ParserBase::haveDiagAtCurrentLoc(&this->super_ParserBase);
    if (!bVar1) {
      SVar4 = Token::location(&local_210);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x460005,SVar4);
    }
    local_220 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
LAB_001e1ee5:
    src = local_220.info;
  }
  else {
    bVar1 = syntax::SyntaxFacts::isPossibleModportPort(local_210.kind);
    if (bVar1) {
      local_200 = uVar3;
      do {
        pMVar5 = parseModportPort(this);
        local_1e0._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pMVar5;
        local_1d0 = 1;
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,
                   (TokenOrSyntax *)&local_1e0._M_first);
        TVar8 = ParserBase::peek(&this->super_ParserBase);
        TVar7 = TVar8.kind;
        bVar1 = syntax::SyntaxFacts::isEndOfParenList(TVar7);
        iVar2 = 3;
        src = extraout_RDX;
        if (TVar7 != EndOfFile && !bVar1) {
          if (TVar7 != Comma) {
            ParserBase::expect(&this->super_ParserBase,Comma);
            do {
              bVar1 = ParserBase::
                      skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleModportPort,&slang::syntax::SyntaxFacts::isEndOfParenList>
                                (&this->super_ParserBase,(DiagCode)0x460005,false);
              if (!bVar1) {
                local_220 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
                src = local_220.info;
                iVar2 = 1;
                goto LAB_001e203c;
              }
              bVar1 = ParserBase::peek(&this->super_ParserBase,Comma);
            } while (!bVar1);
          }
          local_1e0._M_first._M_storage =
               (_Uninitialized<slang::parsing::Token,_true>)
               ParserBase::expect(&this->super_ParserBase,Comma);
          local_1d0 = 0;
          SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                    ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,
                     (TokenOrSyntax *)&local_1e0._M_first);
          TVar8 = ParserBase::peek(&this->super_ParserBase);
          TVar7 = TVar8.kind;
          bVar1 = syntax::SyntaxFacts::isEndOfParenList(TVar7);
          if (TVar7 == EndOfFile || bVar1) {
            ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
            src = extraout_RDX_01;
          }
          else {
            src = extraout_RDX_00;
            if ((local_210.kind == TVar7) && (local_210.info == TVar8.info)) {
              bVar1 = ParserBase::
                      skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleModportPort,&slang::syntax::SyntaxFacts::isEndOfParenList>
                                (&this->super_ParserBase,(DiagCode)0x460005,true);
              src = extraout_RDX_02;
              if (!bVar1) goto LAB_001e203c;
            }
            iVar2 = 0;
            local_210 = TVar8;
          }
        }
LAB_001e203c:
        uVar3 = local_200;
      } while (iVar2 == 0);
      if (iVar2 == 3) {
        local_220 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
        goto LAB_001e1ee5;
      }
    }
    else {
      ParserBase::reportMissingList
                (&this->super_ParserBase,local_210,CloseParenthesis,&local_220,(DiagCode)0x460005);
      src = extraout_RDX_03;
    }
  }
  iVar2 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                    ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,
                     (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)src);
  auStack_1b0._16_8_ = CONCAT44(extraout_var,iVar2);
  auStack_1b0._8_8_ = extraout_RDX_04;
  if ((pointer)local_1c8._0_8_ != (pointer)auStack_1b0) {
    operator_delete((void *)local_1c8._0_8_);
  }
LAB_001e20ab:
  local_1c8._8_4_ = 3;
  local_1c8._16_8_ = (SyntaxNode *)0x0;
  auStack_1b0._0_8_ = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)0x0;
  local_1c8._0_8_ = &PTR_getChild_002f8758;
  local_198._M_extent_value = auStack_1b0._8_8_;
  ports = syntax::SyntaxFactory::ansiPortList
                    (&this->factory,local_1f0,
                     (SeparatedSyntaxList<slang::syntax::MemberSyntax> *)local_1c8,local_220);
  name.info = local_1f8;
  name.kind = (short)uVar3;
  name._2_1_ = (char)((ulong)uVar3 >> 0x10);
  name.numFlags.raw = (char)((ulong)uVar3 >> 0x18);
  name.rawLen = (int)((ulong)uVar3 >> 0x20);
  pMVar6 = syntax::SyntaxFactory::modportItem(&this->factory,name,ports);
  return pMVar6;
}

Assistant:

ModportItemSyntax& Parser::parseModportItem() {
    auto name = expect(TokenKind::Identifier);

    Token openParen, closeParen;
    std::span<TokenOrSyntax> items;
    parseList<isPossibleModportPort, isEndOfParenList>(
        TokenKind::OpenParenthesis, TokenKind::CloseParenthesis, TokenKind::Comma, openParen, items,
        closeParen, RequireItems::True, diag::ExpectedModportPort,
        [this] { return &parseModportPort(); });

    auto& ports = factory.ansiPortList(openParen, items, closeParen);
    return factory.modportItem(name, ports);
}